

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall CFFFileInput::ReadFDSelect(CFFFileInput *this,unsigned_short inFontIndex)

{
  CFFPrimitiveReader *this_00;
  ushort uVar1;
  EStatusCode EVar2;
  LongFilePositionType inNewOffset;
  FontDictInfo **ppFVar3;
  unsigned_long i;
  ulong uVar4;
  undefined6 in_register_00000032;
  ulong uVar5;
  ulong uVar6;
  Byte fdIndex;
  Byte fdIndex_1;
  unsigned_short firstGlyphIndex;
  unsigned_short nextRangeGlyphIndex;
  unsigned_short rangesCount;
  Byte format;
  
  uVar6 = CONCAT62(in_register_00000032,inFontIndex) & 0xffffffff;
  inNewOffset = GetFDSelectPosition(this,inFontIndex);
  if (inNewOffset == 0) {
    EVar2 = eFailure;
  }
  else {
    uVar1 = *(ushort *)
             ((long)&this->mCharStrings->mCharStringsCount +
             (ulong)(uint)((int)CONCAT62(in_register_00000032,inFontIndex) << 4));
    ppFVar3 = (FontDictInfo **)operator_new__((ulong)((uint)uVar1 * 8));
    this->mTopDictIndex[uVar6].mFDSelect = ppFVar3;
    this_00 = &this->mPrimitivesReader;
    CFFPrimitiveReader::SetOffset(this_00,inNewOffset);
    CFFPrimitiveReader::ReadCard8(this_00,&format);
    if (format == '\0') {
      EVar2 = eSuccess;
      for (uVar4 = 0; (EVar2 == eSuccess && (uVar4 < uVar1)); uVar4 = uVar4 + 1) {
        EVar2 = CFFPrimitiveReader::ReadCard8(this_00,&fdIndex_1);
        if (EVar2 != eFailure) {
          this->mTopDictIndex[uVar6].mFDSelect[uVar4] =
               this->mTopDictIndex[uVar6].mFDArray + fdIndex_1;
        }
      }
    }
    else {
      EVar2 = CFFPrimitiveReader::ReadCard16(this_00,&rangesCount);
      if (EVar2 == eFailure) {
        EVar2 = eFailure;
      }
      else {
        EVar2 = CFFPrimitiveReader::ReadCard16(this_00,&firstGlyphIndex);
        for (uVar4 = 0; (EVar2 == eSuccess && (uVar4 < rangesCount)); uVar4 = uVar4 + 1) {
          CFFPrimitiveReader::ReadCard8(this_00,&fdIndex);
          CFFPrimitiveReader::ReadCard16(this_00,&nextRangeGlyphIndex);
          EVar2 = CFFPrimitiveReader::GetInternalState(this_00);
          if (EVar2 != eFailure) {
            for (uVar5 = (ulong)firstGlyphIndex; uVar5 < nextRangeGlyphIndex; uVar5 = uVar5 + 1) {
              this->mTopDictIndex[uVar6].mFDSelect[uVar5] =
                   this->mTopDictIndex[uVar6].mFDArray + fdIndex;
            }
          }
          firstGlyphIndex = nextRangeGlyphIndex;
        }
      }
    }
    if (EVar2 == eSuccess) {
      EVar2 = CFFPrimitiveReader::GetInternalState(this_00);
    }
  }
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadFDSelect(unsigned short inFontIndex)
{
	LongFilePositionType fdSelectLocation = GetFDSelectPosition(inFontIndex);
	unsigned short glyphCount = mCharStrings[inFontIndex].mCharStringsCount;
	EStatusCode status = PDFHummus::eSuccess;
	Byte format;

	// supposed to get here only for CIDs. and they must have an FDSelect...so if it doesn't - fail
	if(0 == fdSelectLocation)
		return PDFHummus::eFailure;

	mTopDictIndex[inFontIndex].mFDSelect = new FontDictInfo*[glyphCount];
	mPrimitivesReader.SetOffset(fdSelectLocation);

	mPrimitivesReader.ReadCard8(format);
	if(0 == format)
	{
		Byte fdIndex;

		for(unsigned long i=0; i < glyphCount && PDFHummus::eSuccess == status; ++i)
		{
			status = mPrimitivesReader.ReadCard8(fdIndex);
			if(status != PDFHummus::eFailure)
				mTopDictIndex[inFontIndex].mFDSelect[i] = mTopDictIndex[inFontIndex].mFDArray+ fdIndex;
		}
	}
	else // format 3
	{
		unsigned short rangesCount;
		unsigned short firstGlyphIndex;
		unsigned short nextRangeGlyphIndex;
		Byte fdIndex;

		status = mPrimitivesReader.ReadCard16(rangesCount);
		if(status != PDFHummus::eFailure)
		{
			status = mPrimitivesReader.ReadCard16(firstGlyphIndex);
			for(unsigned long i=0; i < rangesCount && PDFHummus::eSuccess == status;++i)
			{
				mPrimitivesReader.ReadCard8(fdIndex);
				mPrimitivesReader.ReadCard16(nextRangeGlyphIndex);
				status = mPrimitivesReader.GetInternalState();
				if(status != PDFHummus::eFailure)
					for(unsigned short j=firstGlyphIndex; j < nextRangeGlyphIndex;++j)
						mTopDictIndex[inFontIndex].mFDSelect[j] = 
							mTopDictIndex[inFontIndex].mFDArray + fdIndex;
				firstGlyphIndex = nextRangeGlyphIndex;
			}
		}
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}